

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void luaC_changemode(lua_State *L,int newmode)

{
  global_State *g;
  byte bVar1;
  
  g = L->l_G;
  bVar1 = g->gckind;
  if (bVar1 == 2) {
    g->gckind = '\0';
    bVar1 = 0;
  }
  if ((uint)bVar1 == newmode) {
    return;
  }
  if (newmode != 0) {
    entergen(L,g);
    return;
  }
  minor2inc(L,g,'\0');
  return;
}

Assistant:

void luaC_changemode (lua_State *L, int newmode) {
  global_State *g = G(L);
  if (g->gckind == KGC_GENMAJOR)  /* doing major collections? */
    g->gckind = KGC_INC;  /* already incremental but in name */
  if (newmode != g->gckind) {  /* does it need to change? */
    if (newmode == KGC_INC)  /* entering incremental mode? */
      minor2inc(L, g, KGC_INC);  /* entering incremental mode */
    else {
      lua_assert(newmode == KGC_GENMINOR);
      entergen(L, g);
    }
  }
}